

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

PolicyStatus statusForTarget(cmGeneratorTarget *tgt,char *policy)

{
  int iVar1;
  PolicyStatus PVar2;
  
  iVar1 = strcmp(policy,"CMP0003");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0003(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0004");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0004(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0008");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0008(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0020");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0020(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0021");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0021(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0022");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0022(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0027");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0027(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0037");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0037(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0038");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0038(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0041");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0041(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0042");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0042(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0046");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0046(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0052");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0052(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0060");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0060(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0063");
  if (iVar1 == 0) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0063(tgt);
    return PVar2;
  }
  iVar1 = strcmp(policy,"CMP0065");
  if (iVar1 != 0) {
    iVar1 = strcmp(policy,"CMP0068");
    if (iVar1 == 0) {
      PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0068(tgt);
      return PVar2;
    }
    iVar1 = strcmp(policy,"CMP0069");
    if (iVar1 == 0) {
      PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0069(tgt);
      return PVar2;
    }
    iVar1 = strcmp(policy,"CMP0073");
    if (iVar1 == 0) {
      PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0073(tgt);
      return PVar2;
    }
    iVar1 = strcmp(policy,"CMP0076");
    if (iVar1 != 0) {
      iVar1 = strcmp(policy,"CMP0081");
      if (iVar1 == 0) {
        PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0081(tgt);
        return PVar2;
      }
      iVar1 = strcmp(policy,"CMP0083");
      if (iVar1 == 0) {
        PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0083(tgt);
        return PVar2;
      }
      __assert_fail("false && \"Unreachable code. Not a valid policy\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                    ,0x6a1,
                    "cmPolicies::PolicyStatus statusForTarget(const cmGeneratorTarget *, const char *)"
                   );
    }
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0076(tgt);
    return PVar2;
  }
  PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0065(tgt);
  return PVar2;
}

Assistant:

cmPolicies::PolicyStatus statusForTarget(cmGeneratorTarget const* tgt,
                                         const char* policy)
{
#define RETURN_POLICY(POLICY)                                                 \
  if (strcmp(policy, #POLICY) == 0) {                                         \
    return tgt->GetPolicyStatus##POLICY();                                    \
  }

  CM_FOR_EACH_TARGET_POLICY(RETURN_POLICY)

#undef RETURN_POLICY

  assert(false && "Unreachable code. Not a valid policy");
  return cmPolicies::WARN;
}